

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O3

void __thiscall FKeyBindings::PerformBind(FKeyBindings *this,FCommandLine *argv,char *msg)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  char *pcVar5;
  ulong uVar6;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("%s:\n",msg);
    ppcVar4 = KeyNames;
    uVar6 = 0;
    do {
      pcVar3 = this->Binds[uVar6].Chars;
      if (*(int *)(pcVar3 + -0xc) != 0) {
        pcVar5 = *ppcVar4;
        if (pcVar5 == (char *)0x0) {
          mysnprintf(&KeyName(int)::name,5,"Key_%d",uVar6 & 0xffffffff);
          pcVar3 = this->Binds[uVar6].Chars;
          pcVar5 = &KeyName(int)::name;
        }
        Printf("%s \"%s\"\n",pcVar5,pcVar3);
      }
      uVar6 = uVar6 + 1;
      ppcVar4 = ppcVar4 + 1;
    } while (uVar6 != 0x1c4);
    return;
  }
  pcVar3 = FCommandLine::operator[](argv,1);
  iVar1 = GetKeyFromName(pcVar3);
  if (iVar1 != 0) {
    iVar2 = FCommandLine::argc(argv);
    if (iVar2 == 2) {
      pcVar3 = FCommandLine::operator[](argv,1);
      Printf("\"%s\" = \"%s\"\n",pcVar3,this->Binds[iVar1].Chars);
      return;
    }
    pcVar3 = FCommandLine::operator[](argv,2);
    FString::operator=(this->Binds + iVar1,pcVar3);
    return;
  }
  pcVar3 = FCommandLine::operator[](argv,1);
  Printf("Unknown key \"%s\"\n",pcVar3);
  return;
}

Assistant:

void FKeyBindings::PerformBind(FCommandLine &argv, const char *msg)
{
	int i;

	if (argv.argc() > 1)
	{
		i = GetKeyFromName (argv[1]);
		if (!i)
		{
			Printf ("Unknown key \"%s\"\n", argv[1]);
			return;
		}
		if (argv.argc() == 2)
		{
			Printf ("\"%s\" = \"%s\"\n", argv[1], Binds[i].GetChars());
		}
		else
		{
			Binds[i] = argv[2];
		}
	}
	else
	{
		Printf ("%s:\n", msg);
		
		for (i = 0; i < NUM_KEYS; i++)
		{
			if (!Binds[i].IsEmpty())
				Printf ("%s \"%s\"\n", KeyName (i), Binds[i].GetChars());
		}
	}
}